

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_rtti.cpp
# Opt level: O0

Grand * get_one(void)

{
  int iVar1;
  int iVar2;
  undefined8 local_10;
  Grand *p;
  
  iVar1 = rand();
  iVar1 = iVar1 % 3;
  if (iVar1 == 0) {
    local_10 = (Grand *)operator_new(0x10);
    iVar1 = rand();
    L15_5::Grand::Grand(local_10,iVar1 % 100);
  }
  else if (iVar1 == 1) {
    local_10 = (Grand *)operator_new(0x10);
    iVar1 = rand();
    L15_5::Superb::Superb((Superb *)local_10,iVar1 % 100);
  }
  else if (iVar1 == 2) {
    local_10 = (Grand *)operator_new(0x10);
    iVar1 = rand();
    iVar2 = rand();
    L15_5::Magnificent::Magnificent
              ((Magnificent *)local_10,iVar1 % 100,(char)iVar2 + 'A' + (char)(iVar2 / 0x1a) * -0x1a)
    ;
  }
  return local_10;
}

Assistant:

L15_5::Grand * get_one() {
    using namespace L15_5;

    //  a pointer points to the base class
    Grand * p;
    //  int between 0 and RAND_MAX
    switch(std::rand() % 3) {
        case 0:
            p = new Grand(std::rand() % 100);
            break;
        case 1:
            p = new Superb(std::rand() % 100);
            break;
        case 2:
            p = new Magnificent(std::rand() % 100, 'A' + std::rand() % 26);
            break;
    }

    //  a base-class pointer may actually points to derived class
    return p;
}